

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

FuncInfo * __thiscall
ByteCodeGenerator::StartBindFunction
          (ByteCodeGenerator *this,char16 *name,uint nameLength,uint shortNameOffset,
          bool *pfuncExprWithName,ParseNodeFnc *pnodeFnc,ParseableFunctionInfo *reuseNestedFunc)

{
  Type *pTVar1;
  FncFlags FVar2;
  Utf8SourceInfo *this_00;
  ParseNodeBlock *pPVar3;
  code *pcVar4;
  bool bVar5;
  ushort uVar6;
  charcount_t cVar7;
  BOOL BVar8;
  Attributes AVar9;
  Attributes AVar10;
  LocalFunctionId LVar11;
  PropertyId PVar12;
  uint uVar13;
  undefined4 *puVar14;
  ScopeInfo *pSVar15;
  ParseableFunctionInfo *pPVar16;
  ByteBlock *pBVar17;
  Symbol *sym;
  Scope *this_01;
  FuncInfo *this_02;
  FunctionBody *pFVar18;
  FncFlags FVar19;
  char16 *key;
  Attributes AVar20;
  ByteCodeGenerator *this_03;
  Attributes AVar21;
  Scope *innerScope;
  char cVar22;
  undefined1 auVar23 [16];
  undefined1 auStack_68 [8];
  AutoRestoreFunctionInfo autoRestoreFunctionInfo;
  Scope *local_40;
  
  autoRestoreFunctionInfo.originalEntryPoint = (JavascriptMethod)name;
  if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
    autoRestoreFunctionInfo.funcBody = (FunctionBody *)0x0;
  }
  else {
    autoRestoreFunctionInfo.funcBody =
         (FunctionBody *)
         Js::FunctionProxy::GetOriginalEntryPoint_Unchecked(&reuseNestedFunc->super_FunctionProxy);
  }
  autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
  auStack_68 = (undefined1  [8])reuseNestedFunc;
  if ((this->pCurrentFunction == (FunctionBody *)0x0) ||
     (bVar5 = Js::ParseableFunctionInfo::IsFunctionParsed
                        (&this->pCurrentFunction->super_ParseableFunctionInfo), !bVar5)) {
    FVar2 = pnodeFnc->fncFlags;
    AVar10 = (int)(FVar2 * 8) >> 0x1f & (Async|ErrorOnNew);
    AVar9 = AVar10 | (Lambda|ErrorOnNew);
    if ((FVar2 >> 0xd & 1) == 0) {
      AVar9 = AVar10;
    }
    AVar9 = FVar2 >> 8 & SuperReference | AVar9;
    FVar19 = FVar2 & kFunctionIsClassConstructor;
    if ((FVar2 >> 0x14 & 1) == 0) {
      AVar10 = (FVar19 == kFunctionNone) + Method;
    }
    else if (FVar19 == kFunctionNone) {
      AVar9 = AVar9 | (ClassMethod|ErrorOnNew);
      AVar10 = Method|ErrorOnNew;
    }
    else {
      AVar9 = AVar9 + (FVar2 & kFunctionIsBaseClassConstructor) * 4 | ClassConstructor;
      AVar10 = Method;
    }
    AVar20 = FVar2 >> 6 & ErrorOnNew;
    auVar23._0_4_ = -(uint)((FVar2 & kFunctionHasComputedName) == kFunctionNone);
    auVar23._4_4_ = -(uint)((FVar2 & kFunctionHasNonSimpleParameterList) == kFunctionNone);
    auVar23._8_4_ = -(uint)((FVar2 & kFunctionIsGenerator) == kFunctionNone);
    auVar23._12_4_ = -(uint)((FVar2 & kFunctionIsMethod) == kFunctionNone);
    uVar13 = movmskps(AVar20,auVar23);
    if ((uVar13 & 8) != 0) {
      AVar10 = None;
    }
    AVar21 = (uint)((uVar13 & 2) == 0) << 0x1b | Generator;
    if ((uVar13 & 4) != 0) {
      AVar21 = None;
    }
    AVar10 = AVar10 | AVar9 | AVar21 | (FVar2 & kFunctionIsModule) << 7 | AVar20;
    AVar9 = AVar10 | CanDefer;
    if (pnodeFnc->canBeDeferred == false) {
      AVar9 = AVar10;
    }
    if (((uVar13 & 1) == 0) && (pnodeFnc->pnodeName == (ParseNodeVar *)0x0)) {
      AVar9 = AVar9 | ComputedName;
    }
    cVar22 = *pfuncExprWithName;
    AVar9 = (FVar2 & kFunctionHasHomeObj) << 4 | AVar9;
    if ((DAT_014303c0 == '\0') || (pnodeFnc->pnodeBody != (ParseNodePtr)0x0)) {
      if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
        pFVar18 = Js::FunctionBody::NewFromRecycler
                            (this->scriptContext,
                             (char16 *)autoRestoreFunctionInfo.originalEntryPoint,nameLength,
                             shortNameOffset,pnodeFnc->nestedCount,this->m_utf8SourceInfo,
                             ((((this->m_utf8SourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr)->
                             sourceContextId,pnodeFnc->functionId,AVar9,
                             (FunctionBodyFlags)(FVar19 >> 0xc) ^ Flags_HasNoExplicitReturnValue);
      }
      else {
        bVar5 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
        if (bVar5) {
          pFVar18 = Js::FunctionProxy::GetFunctionBody(&reuseNestedFunc->super_FunctionProxy);
        }
        else {
          this_00 = (reuseNestedFunc->super_FunctionProxy).m_utf8SourceInfo.ptr;
          LVar11 = Js::FunctionProxy::GetLocalFunctionId(&reuseNestedFunc->super_FunctionProxy);
          Js::Utf8SourceInfo::StopTrackingDeferredFunction(this_00,LVar11);
          pPVar16 = Js::FunctionProxy::GetParseableFunctionInfo
                              (&reuseNestedFunc->super_FunctionProxy);
          pFVar18 = Js::FunctionBody::NewFromParseableFunctionInfo(pPVar16);
          autoRestoreFunctionInfo.pfi = &pFVar18->super_ParseableFunctionInfo;
        }
        AVar10 = Js::FunctionProxy::GetAttributes((FunctionProxy *)pFVar18);
        if (((AVar10 ^ AVar9) &
            (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|Module|Async
             |Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|ErrorOnNew)) != None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x57c,
                             "((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask))"
                             ,
                             "(parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask)"
                            );
          goto LAB_0077afe8;
        }
      }
    }
    else if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
      pFVar18 = (FunctionBody *)
                Js::ParseableFunctionInfo::New
                          (this->scriptContext,pnodeFnc->nestedCount,pnodeFnc->functionId,
                           this->m_utf8SourceInfo,
                           (char16 *)autoRestoreFunctionInfo.originalEntryPoint,nameLength,
                           shortNameOffset,AVar9,
                           (FunctionBodyFlags)(FVar19 >> 0xc) ^ Flags_HasNoExplicitReturnValue);
    }
    else {
      bVar5 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
      if (bVar5) {
        pFVar18 = Js::FunctionProxy::GetFunctionBody(&reuseNestedFunc->super_FunctionProxy);
        pBVar17 = Js::FunctionBody::GetByteCode(pFVar18);
        if (pBVar17 == (ByteBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar14 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x590,
                             "(!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr)"
                             ,
                             "!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr"
                            );
          if (!bVar5) goto LAB_0077b460;
          *puVar14 = 0;
        }
      }
      if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x591,"(pnodeFnc->pnodeBody == nullptr)",
                           "pnodeFnc->pnodeBody == nullptr");
        if (!bVar5) goto LAB_0077b460;
        *puVar14 = 0;
      }
      AVar10 = Js::FunctionProxy::GetAttributes(&reuseNestedFunc->super_FunctionProxy);
      pFVar18 = (FunctionBody *)reuseNestedFunc;
      if (((AVar10 ^ AVar9) &
          (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|Module|Async|
           Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|ErrorOnNew)) != None) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar14 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x593,
                           "((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask))"
                           ,
                           "(parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask)"
                          );
LAB_0077afe8:
        if (bVar5 == false) goto LAB_0077b460;
        *puVar14 = 0;
      }
    }
    Js::JavascriptLibrary::RegisterDynamicFunctionReference
              ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,
               (FunctionProxy *)pFVar18);
    (pFVar18->super_ParseableFunctionInfo).deferredParseNextFunctionId =
         pnodeFnc->deferredParseNextFunctionId;
    uVar6 = (*(ushort *)&(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 &
            0xfffb) + ((ushort)pnodeFnc->fncFlags & 2) * 2;
    *(ushort *)&(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 = uVar6;
    (pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 =
         (pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0xdf |
         (byte)(pnodeFnc->fncFlags >> 0xc) & 0x20;
    uVar13 = (ushort)(short)pnodeFnc->fncFlags >> 3 & 8;
    *(ushort *)&(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
         uVar6 & 0xfff7 | (ushort)uVar13;
    if ((pnodeFnc->fncFlags & kFunctionIsAccessor) != kFunctionNone) {
      Js::ScriptContextOptimizationOverrideInfo::SetSideEffects
                (&this->scriptContext->optimizationOverrides,SideEffects_Accessor);
    }
  }
  else {
    cVar7 = Js::ParseableFunctionInfo::StartInDocument
                      (&this->pCurrentFunction->super_ParseableFunctionInfo);
    if (cVar7 != (pnodeFnc->super_ParseNode).ichMin) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x534,"(this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin)",
                         "this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin");
      if (!bVar5) goto LAB_0077b460;
      *puVar14 = 0;
      cVar7 = (pnodeFnc->super_ParseNode).ichMin;
    }
    pFVar18 = this->pCurrentFunction;
    if ((pFVar18->super_ParseableFunctionInfo).m_cchLength !=
        (pnodeFnc->super_ParseNode).ichLim - cVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x535,
                         "(this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints())"
                         ,
                         "this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints()"
                        );
      if (!bVar5) goto LAB_0077b460;
      *puVar14 = 0;
      pFVar18 = this->pCurrentFunction;
    }
    Js::FunctionBody::RemoveDeferParseAttribute(pFVar18);
    BVar8 = Js::FunctionProxy::IsDeferredParseFunction((FunctionProxy *)pFVar18);
    if ((BVar8 != 0) &&
       (((pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x53c,
                         "(!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed())"
                         ,
                         "!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed()"
                        );
      if (!bVar5) goto LAB_0077b460;
      *puVar14 = 0;
    }
    pnodeFnc->fncFlags =
         *(ushort *)&(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 1 &
         kFunctionDeclaration |
         pnodeFnc->fncFlags &
         (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|kFunctionHasDirectSuper|
          kFunctionIsAsync|kFunctionIsDeclaredInParamScope|kFunctionAsmjsMode|kFunctionIsGenerator|
          kFunctionIsStaticMember|kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|
          kFunctionHasHomeObj|kFunctionIsClassMember|kFunctionIsBaseClassConstructor|
          kFunctionIsClassConstructor|kFunctionIsMethod|kFunctionHasSuperReference|
          kFunctionHasNonSimpleParameterList|kFunctionChildCallsEval|kFunctionIsLambda|
          kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
          kFunctionHasDestructuredParams|kFunctionStrictMode|kFunctionHasNonThisStmt|
          kFunctionIsAccessor|kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
          kFunctionUsesArguments|kFunctionCallsEval|kFunctionNested);
    if (pnodeFnc->canBeDeferred == false) {
      AVar9 = Js::FunctionProxy::GetAttributes((FunctionProxy *)pFVar18);
      Js::FunctionProxy::SetAttributes((FunctionProxy *)pFVar18,AVar9 & ~CanDefer);
    }
    if (((((pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 4) == 0) &&
        ((pnodeFnc->fncFlags & kFunctionIsMethod) == kFunctionNone)) &&
       (pnodeFnc->pnodeName != (ParseNodeVar *)0x0)) {
      cVar22 = (pnodeFnc->pnodeName->super_ParseNode).nop == knopVarDecl;
    }
    else {
      cVar22 = false;
    }
    *pfuncExprWithName = (bool)cVar22;
    LVar11 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar18);
    uVar13 = (uint)pfuncExprWithName;
    if ((LVar11 != pnodeFnc->functionId) && (bVar5 = IsInNonDebugMode(this), bVar5)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      uVar13 = 0xf03092;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x54a,
                         "(parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode())"
                         ,
                         "parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode()"
                        );
      if (!bVar5) goto LAB_0077b460;
      *puVar14 = 0;
    }
    Js::FunctionBody::ResetByteCodeGenVisitState(pFVar18);
    pSVar15 = Js::FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)20,Js::ScopeInfo*>
                        ((FunctionProxy *)pFVar18);
    if (pSVar15 != (ScopeInfo *)0x0) {
      pSVar15 = Js::FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)20,Js::ScopeInfo*>
                          ((FunctionProxy *)pFVar18);
      pPVar16 = Js::ScopeInfo::GetParseableFunctionInfo(pSVar15);
      if ((pPVar16 != (ParseableFunctionInfo *)0x0) &&
         ((pPVar16->flags & Flags_HasOrParentHasArguments) != Flags_None)) {
        pTVar1 = &(pFVar18->super_ParseableFunctionInfo).flags;
        *pTVar1 = *pTVar1 | Flags_HasOrParentHasArguments;
      }
    }
  }
  if (cVar22 == '\0') {
    innerScope = (Scope *)0x0;
  }
  else {
    innerScope = pnodeFnc->scope;
    if (innerScope == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      uVar13 = 0xefdce6;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x5b1,"(funcExprScope)","funcExprScope");
      if (!bVar5) goto LAB_0077b460;
      *puVar14 = 0;
    }
    this_03 = this;
    PushScope(this,innerScope);
    sym = AddSymbolToScope(this_03,innerScope,key,uVar13,&pnodeFnc->pnodeName->super_ParseNode,
                           STFunction);
    sym->field_0x42 = sym->field_0x42 | 0x20;
    PVar12 = Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked
                       (&pFVar18->super_ParseableFunctionInfo,&sym->name);
    sym->position = PVar12;
    ParseNodeFnc::SetFuncSymbol(pnodeFnc,sym);
    if ((*(ushort *)&innerScope->field_0x44 & 2) != 0) {
      *(ushort *)&innerScope->field_0x44 = *(ushort *)&innerScope->field_0x44 | 0x10;
    }
  }
  pPVar3 = pnodeFnc->pnodeScopes;
  if (pPVar3 == (ParseNodeBlock *)0x0) {
    this_01 = (Scope *)0x0;
  }
  else {
    this_01 = pPVar3->scope;
  }
  if (pnodeFnc->pnodeBodyScope == (ParseNodeBlock *)0x0) {
    local_40 = (Scope *)0x0;
  }
  else {
    local_40 = pnodeFnc->pnodeBodyScope->scope;
  }
  if (this_01 == (Scope *)0x0) {
    if (pPVar3 != (ParseNodeBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar14 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x5c3,"(paramScope != nullptr || !pnodeFnc->pnodeScopes)",
                         "paramScope != nullptr || !pnodeFnc->pnodeScopes");
      if (!bVar5) goto LAB_0077b460;
      *puVar14 = 0;
    }
    this_01 = (Scope *)new<Memory::ArenaAllocator>(0x48,this->alloc,0x35916e);
    Scope::Scope(this_01,this->alloc,ScopeType_Parameter,1);
    if (pnodeFnc->pnodeScopes != (ParseNodeBlock *)0x0) {
      pnodeFnc->pnodeScopes->scope = this_01;
    }
  }
  if (local_40 == (Scope *)0x0) {
    local_40 = (Scope *)new<Memory::ArenaAllocator>(0x48,this->alloc,0x35916e);
    Scope::Scope(local_40,this->alloc,ScopeType_FunctionBody,1);
    if (pnodeFnc->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      pnodeFnc->pnodeBodyScope->scope = local_40;
    }
  }
  if ((pnodeFnc->super_ParseNode).nop != knopFncDecl) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar14 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x5d5,"(pnodeFnc->nop == knopFncDecl)",
                       "Non-function declaration trying to create function body");
    if (!bVar5) {
LAB_0077b460:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar14 = 0;
  }
  uVar6 = *(ushort *)&(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0xefff
  ;
  *(ushort *)&(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 = uVar6;
  if ((pnodeFnc->fncFlags & kFunctionStrictMode) != kFunctionNone) {
    *(ushort *)&(pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
         uVar6 | 0x100;
  }
  this_02 = (FuncInfo *)new<Memory::ArenaAllocator>(0x300,this->alloc,0x35916e);
  FuncInfo::FuncInfo(this_02,(char16 *)autoRestoreFunctionInfo.originalEntryPoint,this->alloc,this,
                     this_01,local_40,pnodeFnc,&pFVar18->super_ParseableFunctionInfo);
  *(uint *)&this_02->field_0xb4 =
       *(uint *)&this_02->field_0xb4 & 0xfffeffff |
       (uint)(reuseNestedFunc != (ParseableFunctionInfo *)0x0) << 0x10;
  if ((pnodeFnc->fncFlags & kFunctionHasHeapArguments) != kFunctionNone) {
    FuncEscapes(this,local_40);
    FuncInfo::SetHasMaybeEscapedNestedFunc(this_02,L"ArgumentsObjectEscapes");
  }
  bVar5 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar18);
  if (bVar5) {
    pFVar18 = Js::FunctionProxy::GetFunctionBody((FunctionProxy *)pFVar18);
    if (((pFVar18->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0) {
      Js::FunctionBody::SaveState(pFVar18,pnodeFnc);
    }
    else {
      Js::FunctionBody::RestoreState(pFVar18,pnodeFnc);
    }
  }
  uVar13 = *(uint *)&this_02->field_0xb4 & 0xfffffffb | pnodeFnc->fncFlags >> 0xc & 4;
  *(uint *)&this_02->field_0xb4 = uVar13;
  if ((pnodeFnc->fncFlags & kFunctionCallsEval) != kFunctionNone) {
    *(uint *)&this_02->field_0xb4 = uVar13 | 2;
    local_40->field_0x44 = local_40->field_0x44 | 1;
    Scope::SetIsObject(local_40);
    local_40->field_0x44 = local_40->field_0x44 | 0x18;
    Scope::SetIsObject(this_01);
    this_01->field_0x44 = this_01->field_0x44 | 0x18;
  }
  PushFuncInfo(this,L"StartBindFunction",this_02);
  if (innerScope != (Scope *)0x0) {
    innerScope->func = this_02;
    this_02->funcExprScope = innerScope;
  }
  if (this->maxAstSize < pnodeFnc->astSize) {
    this->maxAstSize = pnodeFnc->astSize;
  }
  _auStack_68 = (undefined1  [16])0x0;
  if (pnodeFnc->isBodyAndParamScopeMerged == false) {
    this_02->field_0xb5 = this_02->field_0xb5 & 0x7f;
  }
  Js::AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)auStack_68);
  return this_02;
}

Assistant:

FuncInfo * ByteCodeGenerator::StartBindFunction(const char16 *name, uint nameLength, uint shortNameOffset, bool* pfuncExprWithName, ParseNodeFnc *pnodeFnc, Js::ParseableFunctionInfo * reuseNestedFunc)
{
    bool funcExprWithName;
    Js::ParseableFunctionInfo* parseableFunctionInfo = nullptr;

    Js::AutoRestoreFunctionInfo autoRestoreFunctionInfo(reuseNestedFunc, reuseNestedFunc ? reuseNestedFunc->GetOriginalEntryPoint_Unchecked() : nullptr);

    if (this->pCurrentFunction &&
        this->pCurrentFunction->IsFunctionParsed())
    {
        Assert(this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin);
        Assert(this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints());

        // This is the root function for the current AST subtree, and it already has a FunctionBody
        // (created by a deferred parse) which we're now filling in.
        Js::FunctionBody * parsedFunctionBody = this->pCurrentFunction;
        parsedFunctionBody->RemoveDeferParseAttribute();

        Assert(!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed());

        pnodeFnc->SetDeclaration(parsedFunctionBody->GetIsDeclaration());
        if (!pnodeFnc->CanBeDeferred())
        {
            parsedFunctionBody->SetAttributes(
                (Js::FunctionInfo::Attributes)(parsedFunctionBody->GetAttributes() & ~Js::FunctionInfo::Attributes::CanDefer));
        }
        funcExprWithName =
            !(parsedFunctionBody->GetIsDeclaration() || pnodeFnc->IsMethod()) &&
            pnodeFnc->pnodeName != nullptr &&
            pnodeFnc->pnodeName->nop == knopVarDecl;
        *pfuncExprWithName = funcExprWithName;

        Assert(parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode());

        // Some state may be tracked on the function body during the visit pass. Since the previous visit pass may have failed,
        // we need to reset the state on the function body.
        parsedFunctionBody->ResetByteCodeGenVisitState();

        if (parsedFunctionBody->GetScopeInfo())
        {
            // Propagate flags from the (real) parent function.
            Js::ParseableFunctionInfo *parent = parsedFunctionBody->GetScopeInfo()->GetParseableFunctionInfo();
            if (parent)
            {
                if (parent->GetHasOrParentHasArguments())
                {
                    parsedFunctionBody->SetHasOrParentHasArguments(true);
                }
            }
        }

        parseableFunctionInfo = parsedFunctionBody;
    }
    else
    {
        funcExprWithName = *pfuncExprWithName;
        Js::LocalFunctionId functionId = pnodeFnc->functionId;

        // Create a function body if:
        //  1. The parse node is not defer parsed
        //  2. Or creating function proxies is disallowed
        bool createFunctionBody = (pnodeFnc->pnodeBody != nullptr);
        if (!CONFIG_FLAG(CreateFunctionProxy)) createFunctionBody = true;

        const Js::FunctionInfo::Attributes attributes = GetFunctionInfoAttributes(pnodeFnc);

        if (createFunctionBody)
        {
            if (reuseNestedFunc)
            {
                if (!reuseNestedFunc->IsFunctionBody())
                {
                    reuseNestedFunc->GetUtf8SourceInfo()->StopTrackingDeferredFunction(reuseNestedFunc->GetLocalFunctionId());
                    Js::FunctionBody * parsedFunctionBody =
                        Js::FunctionBody::NewFromParseableFunctionInfo(reuseNestedFunc->GetParseableFunctionInfo());
                    autoRestoreFunctionInfo.funcBody = parsedFunctionBody;
                    parseableFunctionInfo = parsedFunctionBody;
                }
                else
                {
                    parseableFunctionInfo = reuseNestedFunc->GetFunctionBody();
                }
                Assert((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask));
            }
            else
            {
                parseableFunctionInfo = Js::FunctionBody::NewFromRecycler(scriptContext, name, nameLength, shortNameOffset, pnodeFnc->nestedCount, m_utf8SourceInfo,
                    m_utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId, functionId
                    , attributes
                    , pnodeFnc->IsClassConstructor() ?
                        Js::FunctionBody::FunctionBodyFlags::Flags_None :
                        Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
                    , false /* is function from deferred deserialized proxy */
#endif
                );
            }
        }
        else
        {
            if (reuseNestedFunc)
            {
                Assert(!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr);
                Assert(pnodeFnc->pnodeBody == nullptr);
                parseableFunctionInfo = reuseNestedFunc;
                Assert((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask));
            }
            else
            {
                parseableFunctionInfo = Js::ParseableFunctionInfo::New(scriptContext, pnodeFnc->nestedCount, functionId, m_utf8SourceInfo, name, nameLength, shortNameOffset, attributes,
                                        pnodeFnc->IsClassConstructor() ?
                                            Js::FunctionBody::FunctionBodyFlags::Flags_None :
                                            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue);
            }
        }

        // In either case register the function reference
        scriptContext->GetLibrary()->RegisterDynamicFunctionReference(parseableFunctionInfo);

#if DBG
        parseableFunctionInfo->deferredParseNextFunctionId = pnodeFnc->deferredParseNextFunctionId;
#endif
        parseableFunctionInfo->SetIsDeclaration(pnodeFnc->IsDeclaration() != 0);
        parseableFunctionInfo->SetIsMethod(pnodeFnc->IsMethod() != 0);
        parseableFunctionInfo->SetIsAccessor(pnodeFnc->IsAccessor() != 0);
        if (pnodeFnc->IsAccessor())
        {
            scriptContext->optimizationOverrides.SetSideEffects(Js::SideEffects_Accessor);
        }
    }

    Scope *funcExprScope = nullptr;
    if (funcExprWithName)
    {
        funcExprScope = pnodeFnc->scope;
        Assert(funcExprScope);
        PushScope(funcExprScope);
        Symbol *sym = AddSymbolToScope(funcExprScope, name, nameLength, pnodeFnc->pnodeName, STFunction);

        sym->SetIsFuncExpr(true);

        sym->SetPosition(parseableFunctionInfo->GetOrAddPropertyIdTracked(sym->GetName()));

        pnodeFnc->SetFuncSymbol(sym);

        if (funcExprScope->GetIsObject())
        {
            funcExprScope->SetMustInstantiate(true);
        }
    }

    Scope *paramScope = pnodeFnc->pnodeScopes ? pnodeFnc->pnodeScopes->scope : nullptr;
    Scope *bodyScope = pnodeFnc->pnodeBodyScope ? pnodeFnc->pnodeBodyScope->scope : nullptr;
    Assert(paramScope != nullptr || !pnodeFnc->pnodeScopes);
    if (paramScope == nullptr)
    {
        paramScope = Anew(alloc, Scope, alloc, ScopeType_Parameter, true);
        if (pnodeFnc->pnodeScopes)
        {
            pnodeFnc->pnodeScopes->scope = paramScope;
        }
    }
    if (bodyScope == nullptr)
    {
        bodyScope = Anew(alloc, Scope, alloc, ScopeType_FunctionBody, true);
        if (pnodeFnc->pnodeBodyScope)
        {
            pnodeFnc->pnodeBodyScope->scope = bodyScope;
        }
    }

    AssertMsg(pnodeFnc->nop == knopFncDecl, "Non-function declaration trying to create function body");

    parseableFunctionInfo->SetIsGlobalFunc(false);
    if (pnodeFnc->GetStrictMode() != 0)
    {
        parseableFunctionInfo->SetIsStrictMode();
    }

    FuncInfo *funcInfo = Anew(alloc, FuncInfo, name, alloc, this, paramScope, bodyScope, pnodeFnc, parseableFunctionInfo);

#if DBG
    funcInfo->isReused = (reuseNestedFunc != nullptr);
#endif

    if (pnodeFnc->GetArgumentsObjectEscapes())
    {
        // If the parser detected that the arguments object escapes, then the function scope escapes
        // and cannot be cached.
        this->FuncEscapes(bodyScope);
        funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("ArgumentsObjectEscapes")));
    }

    if (parseableFunctionInfo->IsFunctionBody())
    {
        Js::FunctionBody * parsedFunctionBody = parseableFunctionInfo->GetFunctionBody();
        if (parsedFunctionBody->IsReparsed())
        {
            parsedFunctionBody->RestoreState(pnodeFnc);
        }
        else
        {
            parsedFunctionBody->SaveState(pnodeFnc);
        }
    }

    funcInfo->SetChildCallsEval(!!pnodeFnc->ChildCallsEval());

    if (pnodeFnc->CallsEval())
    {
        funcInfo->SetCallsEval(true);

        bodyScope->SetIsDynamic(true);
        bodyScope->SetIsObject();
        bodyScope->SetCapturesAll(true);
        bodyScope->SetMustInstantiate(true);

        // Do not mark param scope as dynamic as it does not leak declarations
        paramScope->SetIsObject();
        paramScope->SetCapturesAll(true);
        paramScope->SetMustInstantiate(true);
    }

    PushFuncInfo(_u("StartBindFunction"), funcInfo);

    if (funcExprScope)
    {
        funcExprScope->SetFunc(funcInfo);
        funcInfo->funcExprScope = funcExprScope;
    }

    int32 currentAstSize = pnodeFnc->astSize;
    if (currentAstSize > this->maxAstSize)
    {
        this->maxAstSize = currentAstSize;
    }

    autoRestoreFunctionInfo.Clear();

    if (!pnodeFnc->IsBodyAndParamScopeMerged())
    {
        funcInfo->ResetBodyAndParamScopeMerged();
    }

    return funcInfo;
}